

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_setup(connectdata *conn)

{
  uchar *plaintext;
  char *pcVar1;
  long lVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  uchar nt_hash [21];
  uchar lm_hash [21];
  uchar nt [24];
  uchar lm [24];
  smb_setup msg;
  uchar auStack_4c8 [32];
  uchar local_4a8 [32];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined2 local_44d [2];
  undefined4 local_448;
  undefined2 local_444;
  uint local_442;
  undefined4 local_43e;
  undefined4 local_436;
  short local_432;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  char local_400;
  char cStack_3ff;
  undefined4 uStack_3fe;
  undefined2 uStack_3fa;
  undefined4 uStack_3f8;
  undefined1 auStack_3f4 [30];
  char acStack_3d6 [934];
  
  sVar4 = strlen((char *)(conn->proto).ftpc.pp.cache_size);
  sVar5 = strlen((char *)(conn->proto).ftpc.pp.nread_resp);
  CVar3 = CURLE_FILESIZE_EXCEEDED;
  if (0xfffffffffffffbfe < (sVar4 + sVar5) - 0x3c4) {
    Curl_ntlm_core_mk_lm_hash(conn->data,conn->passwd,local_4a8);
    plaintext = (conn->proto).smbc.challenge;
    Curl_ntlm_core_lm_resp(local_4a8,plaintext,(uchar *)&local_468);
    Curl_ntlm_core_mk_nt_hash(conn->data,conn->passwd,auStack_4c8);
    Curl_ntlm_core_lm_resp(auStack_4c8,plaintext,(uchar *)&local_488);
    memset(local_44d,0,0x41d);
    local_44d[0] = 0xff0d;
    local_448 = 0x19000;
    local_444 = 1;
    local_442 = (conn->proto).smbc.session_key;
    local_436 = 8;
    local_43e = 0x180018;
    local_420 = local_458;
    local_430 = local_468;
    uStack_428 = uStack_460;
    local_408 = local_478;
    local_418 = local_488;
    uStack_410 = uStack_480;
    pcVar1 = (char *)(conn->proto).ftpc.pp.cache_size;
    strcpy(&local_400,pcVar1);
    sVar4 = strlen(pcVar1);
    pcVar1 = (char *)(conn->proto).ftpc.pp.nread_resp;
    strcpy(&cStack_3ff + sVar4,pcVar1);
    sVar5 = strlen(pcVar1);
    lVar2 = sVar5 + sVar4;
    *(undefined4 *)((long)&uStack_3fe + lVar2) = 0x756e694c;
    *(undefined2 *)((long)&uStack_3fa + lVar2) = 0x78;
    *(undefined4 *)(auStack_3f4 + lVar2 + -4) = 0x6c727563;
    auStack_3f4[lVar2] = 0;
    local_432 = (short)(&cStack_3ff + (lVar2 - (long)&local_430)) + 0xc;
    CVar3 = smb_send_message(conn,'s',local_44d,
                             (size_t)(&cStack_3ff + (lVar2 - (long)&local_430) + 0x29));
  }
  return CVar3;
}

Assistant:

static CURLcode smb_send_setup(struct connectdata *conn)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  size_t byte_count = sizeof(lm) + sizeof(nt);
  byte_count += strlen(smbc->user) + strlen(smbc->domain);
  byte_count += strlen(OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(conn->data, conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
#ifdef USE_NTRESPONSES
  Curl_ntlm_core_mk_nt_hash(conn->data, conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);
#else
  memset(nt, 0, sizeof(nt));
#endif

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  MSGCATNULL(smbc->user);
  MSGCATNULL(smbc->domain);
  MSGCATNULL(OS);
  MSGCATNULL(CLIENTNAME);
  byte_count = p - msg.bytes;
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(conn, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}